

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Serializer.cpp
# Opt level: O1

void __thiscall
adios2::format::BP4Serializer::PutProcessGroupIndex
          (BP4Serializer *this,string *ioName,string *hostLanguage,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *transportsTypes)

{
  long *plVar1;
  uint __val;
  _func_int *p_Var2;
  long lVar3;
  iterator __position;
  pointer pcVar4;
  _func_int *p_Var5;
  long lVar6;
  _func_int **pp_Var7;
  vector<char,_std::allocator<char>_> *buffer;
  char cVar8;
  bool bVar9;
  char cVar10;
  byte bVar11;
  pointer puVar12;
  uint uVar13;
  code *position;
  vector<char,_std::allocator<char>_> *buffer_00;
  char columnMajor;
  string timeStepName;
  difference_type __offset;
  uint32_t processID;
  vector<unsigned_char,_std::allocator<unsigned_char>_> methodIDs;
  char local_181;
  vector<char,_std::allocator<char>_> *local_180;
  BPSerializer *local_178;
  char *local_170;
  uint local_168;
  undefined4 uStack_164;
  char local_160 [16];
  long local_150;
  long local_148;
  string *local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_138;
  uint local_12c;
  string local_128;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  p_Var2 = (this->super_BP4Base)._vptr_BP4Base[-3];
  local_138 = transportsTypes;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"buffering","");
  profiling::IOChrono::Start
            ((IOChrono *)(&(this->super_BP4Base).field_0x278 + (long)p_Var2),&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  p_Var2 = (this->super_BP4Base)._vptr_BP4Base[-3];
  local_180 = (vector<char,_std::allocator<char>_> *)
              (&(this->super_BP4Base).field_0xe8 + (long)p_Var2);
  local_148 = *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer);
  *(undefined4 *)
   (*(long *)(p_Var2 + 0x30 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) + local_148
   ) = 0x4947505b;
  lVar3 = *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer);
  *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) = lVar3 + 4;
  *(long *)(&(this->super_BP4Base).field_0x1a8 + (long)(this->super_BP4Base)._vptr_BP4Base[-3]) =
       lVar3 + 4;
  *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) =
       *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) + 8;
  __position._M_current = *(char **)(&(this->super_BP4Base).field_0xf0 + (long)p_Var2);
  local_150 = (long)__position._M_current -
              (long)(local_180->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_start;
  local_170 = (char *)((ulong)local_170 & 0xffffffffffffff00);
  std::vector<char,_std::allocator<char>_>::_M_fill_insert
            (local_180,__position,2,(value_type *)&local_170);
  pcVar4 = (ioName->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar4,pcVar4 + ioName->_M_string_length);
  local_178 = (BPSerializer *)&(this->super_BP4Base).field_0xa0;
  BPSerializer::PutNameRecord(local_178,&local_70,local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  pcVar4 = (hostLanguage->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar4,pcVar4 + hostLanguage->_M_string_length);
  buffer_00 = (vector<char,_std::allocator<char>_> *)
              (p_Var2 + 0x30 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer);
  position = p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer;
  local_140 = ioName;
  bVar9 = helper::IsRowMajor(&local_f0);
  local_181 = 'y';
  if (bVar9) {
    local_181 = 'n';
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  helper::InsertToBuffer<char>(local_180,&local_181,1);
  (buffer_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
  _M_start[*(long *)position] = local_181;
  *(long *)position = *(long *)position + 1;
  pcVar4 = (local_140->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar4,pcVar4 + local_140->_M_string_length);
  BPSerializer::PutNameRecord(local_178,&local_90,buffer_00,(size_t *)position);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_12c = *(uint *)((this->super_BP4Base)._vptr_BP4Base[-3] + 8 +
                       (long)&(this->super_BP4Base).m_MetadataIndexTable._M_h);
  helper::InsertToBuffer<unsigned_int>(local_180,&local_12c,1);
  *(long *)position = *(long *)position + 4;
  __val = *(uint *)(&(this->super_BP4Base).field_0xe0 +
                   (long)(this->super_BP4Base)._vptr_BP4Base[-3]);
  cVar10 = '\x01';
  if (9 < __val) {
    uVar13 = __val;
    cVar8 = '\x04';
    do {
      cVar10 = cVar8;
      if (uVar13 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_005793f2;
      }
      if (uVar13 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_005793f2;
      }
      if (uVar13 < 10000) goto LAB_005793f2;
      bVar9 = 99999 < uVar13;
      uVar13 = uVar13 / 10000;
      cVar8 = cVar10 + '\x04';
    } while (bVar9);
    cVar10 = cVar10 + '\x01';
  }
LAB_005793f2:
  local_170 = local_160;
  std::__cxx11::string::_M_construct((ulong)&local_170,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_170,local_168,__val);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,local_170,local_170 + CONCAT44(uStack_164,local_168));
  BPSerializer::PutNameRecord(local_178,&local_b0,local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_170,local_170 + CONCAT44(uStack_164,local_168));
  BPSerializer::PutNameRecord(local_178,&local_d0,buffer_00,(size_t *)position);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  buffer = local_180;
  helper::InsertToBuffer<unsigned_int>
            (local_180,
             (uint *)(&(this->super_BP4Base).field_0xe0 +
                     (long)(this->super_BP4Base)._vptr_BP4Base[-3]),1);
  *(undefined4 *)
   (*(long *)(p_Var2 + 0x30 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) +
   *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer)) =
       *(undefined4 *)
        (&(this->super_BP4Base).field_0xe0 + (long)(this->super_BP4Base)._vptr_BP4Base[-3]);
  *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) =
       *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) + 4;
  p_Var5 = (this->super_BP4Base)._vptr_BP4Base[-3];
  local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(*(long *)(p_Var5 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndexTable._M_h) +
                *(long *)(p_Var5 + 0x28 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer)
                );
  helper::InsertToBuffer<unsigned_long>(buffer,(unsigned_long *)&local_108,1);
  lVar3 = *(long *)(&(this->super_BP4Base).field_0xe8 + (long)p_Var2);
  *(short *)(local_150 + lVar3) =
       ((short)*(undefined4 *)(&(this->super_BP4Base).field_0xf0 + (long)p_Var2) -
       ((short)local_150 + (short)lVar3)) + -2;
  BPBase::GetTransportIDs
            (&local_108,
             (BPBase *)
             ((long)&(this->super_BP4Base)._vptr_BP4Base +
             (long)(this->super_BP4Base)._vptr_BP4Base[-3]),local_138);
  bVar11 = (char)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (char)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
  *(byte *)(*(long *)(p_Var2 + 0x30 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) +
           *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer)) =
       bVar11;
  lVar3 = *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer);
  lVar6 = *(long *)(p_Var2 + 0x30 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer);
  *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) = lVar3 + 1;
  *(ushort *)(lVar6 + 1 + lVar3) = (ushort)bVar11 + (ushort)bVar11 * 2;
  *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) =
       *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) + 2;
  for (puVar12 = local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
      puVar12 !=
      local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish; puVar12 = puVar12 + 1) {
    (buffer_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_start[*(long *)position] = *puVar12;
    *(long *)position = *(long *)position + 3;
  }
  pp_Var7 = (this->super_BP4Base)._vptr_BP4Base;
  *(long *)(pp_Var7[-3] + 0x28 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) =
       *(long *)(pp_Var7[-3] + 0x28 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) +
       (*(long *)position - local_148);
  *(undefined4 *)(&(this->super_BP4Base).field_0x1b0 + (long)pp_Var7[-3]) = 0;
  *(undefined8 *)(&(this->super_BP4Base).field_0x1b8 + (long)pp_Var7[-3]) = *(undefined8 *)position;
  *(long *)position = *(long *)position + 0xc;
  *(long *)(pp_Var7[-3] + 0x28 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) =
       *(long *)(pp_Var7[-3] + 0x28 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) +
       0xc;
  plVar1 = (long *)(&(this->super_BP4Base).field_0x1a0 + (long)pp_Var7[-3]);
  *plVar1 = *plVar1 + 1;
  (&(this->super_BP4Base).field_0x1c0)[(long)pp_Var7[-3]] = 1;
  p_Var2 = pp_Var7[-3];
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"buffering","");
  profiling::IOChrono::Stop
            ((IOChrono *)(&(this->super_BP4Base).field_0x278 + (long)p_Var2),&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_170 != local_160) {
    operator_delete(local_170);
  }
  return;
}

Assistant:

void BP4Serializer::PutProcessGroupIndex(const std::string &ioName, const std::string hostLanguage,
                                         const std::vector<std::string> &transportsTypes) noexcept
{
    m_Profiler.Start("buffering");
    std::vector<char> &metadataBuffer = m_MetadataSet.PGIndex.Buffer;

    std::vector<char> &dataBuffer = m_Data.m_Buffer;
    size_t &dataPosition = m_Data.m_Position;
    const size_t pgBeginPosition = dataPosition;

    // write a block identifier [PGI
    const char pgi[] = "[PGI"; //  don't write \0!
    helper::CopyToBuffer(dataBuffer, dataPosition, pgi, sizeof(pgi) - 1);

    m_MetadataSet.DataPGLengthPosition = dataPosition;
    dataPosition += 8; // skip pg length (8)

    const std::size_t metadataPGLengthPosition = metadataBuffer.size();
    metadataBuffer.insert(metadataBuffer.end(), 2, '\0'); // skip pg length (2)

    // write name to metadata
    PutNameRecord(ioName, metadataBuffer);

    // write if data is column major in metadata and data
    const char columnMajor = (helper::IsRowMajor(hostLanguage) == false) ? 'y' : 'n';
    helper::InsertToBuffer(metadataBuffer, &columnMajor);
    helper::CopyToBuffer(dataBuffer, dataPosition, &columnMajor);

    // write name in data
    PutNameRecord(ioName, dataBuffer, dataPosition);

    // processID in metadata,
    const uint32_t processID = static_cast<uint32_t>(m_RankMPI);
    helper::InsertToBuffer(metadataBuffer, &processID);
    // skip coordination var in data ....what is coordination var?
    dataPosition += 4;

    // time step name to metadata and data
    const std::string timeStepName(std::to_string(m_MetadataSet.TimeStep));
    PutNameRecord(timeStepName, metadataBuffer);
    PutNameRecord(timeStepName, dataBuffer, dataPosition);

    // time step to metadata and data
    helper::InsertToBuffer(metadataBuffer, &m_MetadataSet.TimeStep);
    helper::CopyToBuffer(dataBuffer, dataPosition, &m_MetadataSet.TimeStep);

    // offset to pg in data in metadata which is the current absolute position
    helper::InsertU64(metadataBuffer, m_Data.m_AbsolutePosition + m_PreDataFileLength);

    // Back to writing metadata pg index length (length of group)
    const uint16_t metadataPGIndexLength =
        static_cast<uint16_t>(metadataBuffer.size() - metadataPGLengthPosition - 2);

    size_t backPosition = metadataPGLengthPosition;
    helper::CopyToBuffer(metadataBuffer, backPosition, &metadataPGIndexLength);
    // DONE With metadataBuffer

    // here write method in data
    const std::vector<uint8_t> methodIDs = GetTransportIDs(transportsTypes);
    const uint8_t methodsCount = static_cast<uint8_t>(methodIDs.size());
    helper::CopyToBuffer(dataBuffer, dataPosition, &methodsCount); // count
    // methodID (1) + method params length(2), no parameters for now
    const uint16_t methodsLength = static_cast<uint16_t>(methodsCount * 3);

    helper::CopyToBuffer(dataBuffer, dataPosition, &methodsLength); // length

    for (const auto methodID : methodIDs)
    {
        helper::CopyToBuffer(dataBuffer, dataPosition, &methodID); // method ID,
        dataPosition += 2; // skip method params length = 0 (2 bytes) for now
    }

    // update absolute position
    m_Data.m_AbsolutePosition += dataPosition - pgBeginPosition;
    // pg vars count and position
    m_MetadataSet.DataPGVarsCount = 0;
    m_MetadataSet.DataPGVarsCountPosition = dataPosition;
    // add vars count and length
    dataPosition += 12;
    m_Data.m_AbsolutePosition += 12; // add vars count and length

    ++m_MetadataSet.DataPGCount;
    m_MetadataSet.DataPGIsOpen = true;

    m_Profiler.Stop("buffering");
}